

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

bool ELFIO::elfio::is_subsequence_of(segment *seg1,segment *seg2)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ushort *puVar6;
  bool bVar7;
  
  puVar4 = (undefined8 *)(**(code **)(*(long *)seg1 + 0xd8))();
  puVar5 = (undefined8 *)(**(code **)(*(long *)seg2 + 0xd8))(seg2);
  puVar6 = (ushort *)*puVar4;
  puVar1 = (ushort *)puVar4[1];
  puVar2 = (ushort *)*puVar5;
  puVar3 = (ushort *)puVar5[1];
  if ((ulong)((long)puVar1 - (long)puVar6) < (ulong)((long)puVar3 - (long)puVar2)) {
    if ((puVar6 != puVar1) && (puVar2 != puVar3)) {
      do {
        if (*puVar6 < *puVar2) goto LAB_001078e4;
        puVar6 = puVar6 + (*puVar6 <= *puVar2);
      } while ((puVar2 + 1 != puVar3) && (puVar2 = puVar2 + 1, puVar6 != puVar1));
    }
    bVar7 = puVar6 == puVar1;
  }
  else {
LAB_001078e4:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

static bool is_subsequence_of( const segment* seg1, const segment* seg2 )
    {
        // Return 'true' if sections of seg1 are a subset of sections in seg2
        const std::vector<Elf_Half>& sections1 = seg1->get_sections();
        const std::vector<Elf_Half>& sections2 = seg2->get_sections();

        bool found = false;
        if ( sections1.size() < sections2.size() ) {
            found = std::includes( sections2.begin(), sections2.end(),
                                   sections1.begin(), sections1.end() );
        }

        return found;
    }